

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

int NULLCFile::FileReadType<double>(double *data,File *file)

{
  size_t sVar1;
  File *file_local;
  double *data_local;
  
  if (file == (File *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    data_local._4_4_ = 0;
  }
  else if (file->handle == (FILE *)0x0) {
    nullcThrowError("Cannot read from a closed file.");
    data_local._4_4_ = 0;
  }
  else {
    sVar1 = fread(data,8,1,(FILE *)file->handle);
    data_local._4_4_ = (uint)(sVar1 == 1);
  }
  return data_local._4_4_;
}

Assistant:

int FileReadType(T* data, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot read from a closed file.");
			return 0;
		}

		return 1 == fread(data, sizeof(T), 1, file->handle);
	}